

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low_level_alloc.cc
# Opt level: O0

Arena * absl::base_internal::LowLevelAlloc::NewArena(int32_t flags)

{
  Arena *this;
  Arena *result;
  Arena *meta_data_arena;
  int32_t flags_local;
  
  result = DefaultArena();
  if ((flags & 2U) == 0) {
    if ((flags & 1U) == 0) {
      result = anon_unknown_0::UnhookedArena();
    }
  }
  else {
    result = anon_unknown_0::UnhookedAsyncSigSafeArena();
  }
  this = (Arena *)AllocWithArena(0x148,result);
  Arena::Arena(this,flags);
  return this;
}

Assistant:

LowLevelAlloc::Arena *LowLevelAlloc::NewArena(int32_t flags) {
  Arena *meta_data_arena = DefaultArena();
#ifndef ABSL_LOW_LEVEL_ALLOC_ASYNC_SIGNAL_SAFE_MISSING
  if ((flags & LowLevelAlloc::kAsyncSignalSafe) != 0) {
    meta_data_arena = UnhookedAsyncSigSafeArena();
  } else  // NOLINT(readability/braces)
#endif
      if ((flags & LowLevelAlloc::kCallMallocHook) == 0) {
    meta_data_arena = UnhookedArena();
  }
  Arena *result =
    new (AllocWithArena(sizeof (*result), meta_data_arena)) Arena(flags);
  return result;
}